

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool __thiscall
QCss::ValueExtractor::extractImage(ValueExtractor *this,QIcon *icon,Alignment *a,QSize *size)

{
  bool bVar1;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> QVar2;
  QString *fileName;
  size_t __nbytes;
  DeclarationData *pDVar3;
  qsizetype qVar4;
  const_reference pVVar5;
  QSize QVar6;
  QSize *in_RCX;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> *in_RDX;
  void *__buf;
  QSize *in_RDI;
  long in_FS_OFFSET;
  Declaration *decl;
  int i;
  bool hit;
  QImageReader imageReader;
  qsizetype in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  Property in_stack_ffffffffffffff44;
  int local_a0;
  bool local_99;
  QImageReader in_stack_ffffffffffffff90;
  undefined1 *local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_99 = false;
  local_a0 = 0;
  do {
    fileName = (QString *)(long)local_a0;
    __nbytes = QList<QCss::Declaration>::size((QList<QCss::Declaration> *)in_RDI);
    if ((long)__nbytes <= (long)fileName) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return local_99;
    }
    QList<QCss::Declaration>::at
              ((QList<QCss::Declaration> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38);
    pDVar3 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa33db9
                       );
    in_stack_ffffffffffffff44 = pDVar3->propertyId;
    if (in_stack_ffffffffffffff44 == QtImage) {
      Declaration::iconValue((Declaration *)in_stack_ffffffffffffff90.d);
      QIcon::operator=((QIcon *)in_RDI,(QIcon *)fileName);
      QIcon::~QIcon((QIcon *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      pDVar3 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                         ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
                          0xa33e14);
      qVar4 = QList<QCss::Value>::size(&pDVar3->values);
      if (0 < qVar4) {
        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                  ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa33e34);
        pVVar5 = QList<QCss::Value>::at
                           ((QList<QCss::Value> *)
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            in_stack_ffffffffffffff38);
        if (pVVar5->type == Uri) {
          local_18[0] = &DAT_aaaaaaaaaaaaaaaa;
          QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                    ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa33e66);
          QList<QCss::Value>::at
                    ((QList<QCss::Value> *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     in_stack_ffffffffffffff38);
          ::QVariant::toString();
          QByteArray::QByteArray((QByteArray *)0xa33e97);
          QImageReader::QImageReader
                    ((QImageReader *)in_RDI,fileName,
                     (QByteArray *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
          QByteArray::~QByteArray((QByteArray *)0xa33ec1);
          QString::~QString((QString *)0xa33ece);
          QVar6 = QImageReader::size((QImageReader *)
                                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
          *in_RCX = QVar6;
          bVar1 = QSize::isNull(in_RDI);
          if (bVar1) {
            QImageReader::read((QImageReader *)&stack0xffffffffffffff90,(int)local_18,__buf,__nbytes
                              );
            QVar6 = QImage::size((QImage *)
                                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
            *in_RCX = QVar6;
            QImage::~QImage((QImage *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40))
            ;
          }
          QImageReader::~QImageReader
                    ((QImageReader *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        }
      }
LAB_00a33f5c:
      local_99 = true;
    }
    else if (in_stack_ffffffffffffff44 == QtImageAlignment) {
      QVar2.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (QFlagsStorage<Qt::AlignmentFlag>)Declaration::alignmentValue((Declaration *)in_RDI);
      in_RDX->super_QFlagsStorage<Qt::AlignmentFlag> =
           QVar2.super_QFlagsStorage<Qt::AlignmentFlag>.i;
      goto LAB_00a33f5c;
    }
    local_a0 = local_a0 + 1;
  } while( true );
}

Assistant:

bool ValueExtractor::extractImage(QIcon *icon, Qt::Alignment *a, QSize *size)
{
    bool hit = false;
    for (int i = 0; i < declarations.size(); ++i) {
        const Declaration &decl = declarations.at(i);
        switch (decl.d->propertyId) {
        case QtImage:
            *icon = decl.iconValue();
            if (decl.d->values.size() > 0 && decl.d->values.at(0).type == Value::Uri) {
                // try to pull just the size from the image...
                QImageReader imageReader(decl.d->values.at(0).variant.toString());
                if ((*size = imageReader.size()).isNull()) {
                    // but we'll have to load the whole image if the
                    // format doesn't support just reading the size
                    *size = imageReader.read().size();
                }
            }
            break;
        case QtImageAlignment: *a = decl.alignmentValue();  break;
        default: continue;
        }
        hit = true;
    }
    return hit;
}